

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::CommandMigrate
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aDstAddr,string *aDstNetworkName)

{
  _func_void *p_Var1;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  CommissionerSafe *local_98;
  _Any_data local_90;
  long local_80;
  undefined8 uStack_78;
  string local_70 [32];
  string local_50 [32];
  
  local_98 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_90,aHandler);
  std::__cxx11::string::string(local_70,(string *)aDstAddr);
  std::__cxx11::string::string(local_50,(string *)aDstNetworkName);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x68);
  *(CommissionerSafe **)p_Var1 = local_98;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_78;
  if (local_80 != 0) {
    *(void **)(p_Var1 + 8) = local_90._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_90._8_8_;
    *(long *)(p_Var1 + 0x18) = local_80;
    local_80 = 0;
    uStack_78 = 0;
  }
  std::__cxx11::string::string((string *)(p_Var1 + 0x28),local_70);
  std::__cxx11::string::string((string *)(p_Var1 + 0x48),local_50);
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:429:22)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:429:22)>
             ::_M_manager;
  local_b8._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  CommandMigrate(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_98);
  return;
}

Assistant:

void CommissionerSafe::CommandMigrate(ErrorHandler       aHandler,
                                      const std::string &aDstAddr,
                                      const std::string &aDstNetworkName)
{
    PushAsyncRequest([=]() { mImpl->CommandMigrate(aHandler, aDstAddr, aDstNetworkName); });
}